

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getKeywordType(TokenKind kind)

{
  undefined4 local_c;
  TokenKind kind_local;
  
  if (kind == CHandleKeyword) {
    local_c = CHandleType;
  }
  else if (kind == EventKeyword) {
    local_c = EventType;
  }
  else if (kind == RealKeyword) {
    local_c = RealType;
  }
  else if (kind == RealTimeKeyword) {
    local_c = RealTimeType;
  }
  else if (kind == ShortRealKeyword) {
    local_c = ShortRealType;
  }
  else if (kind == StringKeyword) {
    local_c = StringType;
  }
  else if (kind == VoidKeyword) {
    local_c = VoidType;
  }
  else {
    local_c = Unknown;
  }
  return local_c;
}

Assistant:

SyntaxKind SyntaxFacts::getKeywordType(TokenKind kind) {
    switch (kind) {
        case TokenKind::ShortRealKeyword: return SyntaxKind::ShortRealType;
        case TokenKind::RealKeyword: return SyntaxKind::RealType;
        case TokenKind::RealTimeKeyword: return SyntaxKind::RealTimeType;
        case TokenKind::StringKeyword: return SyntaxKind::StringType;
        case TokenKind::CHandleKeyword: return SyntaxKind::CHandleType;
        case TokenKind::EventKeyword: return SyntaxKind::EventType;
        case TokenKind::VoidKeyword: return SyntaxKind::VoidType;
        default: return SyntaxKind::Unknown;
    }
}